

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

undefined8 cfd::api::json::DecodePsbtRequest::GetPsbtString_abi_cxx11_(DecodePsbtRequest *obj)

{
  undefined8 in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  
  core::ConvertToString<std::__cxx11::string>(in_stack_00000088);
  return in_RDI;
}

Assistant:

static std::string GetPsbtString(  // line separate
      const DecodePsbtRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.psbt_);
  }